

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O3

int push_captures(MatchState *ms,char *s,char *e)

{
  int size;
  int iVar1;
  
  iVar1 = ms->level;
  size = 1;
  if (iVar1 != 0) {
    size = iVar1;
  }
  if (s == (char *)0x0) {
    size = iVar1;
  }
  luaL_checkstack(ms->L,size,"too many captures");
  if (0 < size) {
    iVar1 = 0;
    do {
      push_onecapture(ms,iVar1,s,e);
      iVar1 = iVar1 + 1;
    } while (size != iVar1);
  }
  return size;
}

Assistant:

static int push_captures(MatchState *ms, const char *s, const char *e)
{
  int i;
  int nlevels = (ms->level == 0 && s) ? 1 : ms->level;
  luaL_checkstack(ms->L, nlevels, "too many captures");
  for (i = 0; i < nlevels; i++)
    push_onecapture(ms, i, s, e);
  return nlevels;  /* number of strings pushed */
}